

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O3

int __thiscall uttt::RandomPlayout::operator()(RandomPlayout *this,IBoard *game)

{
  char cVar1;
  short sVar2;
  pointer pcVar3;
  pointer pcVar4;
  result_type_conflict1 rVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  size_t __i;
  array<short,_9UL> *paVar10;
  vector<long,_std::allocator<long>_> moves;
  IBoard ngame;
  param_type local_80;
  vector<long,_std::allocator<long>_> local_78;
  long local_58;
  uniform_int_distribution<int> local_50;
  IBoard local_48;
  
  if ((operator()(uttt::IBoard_const&)::rd == '\0') &&
     (iVar6 = __cxa_guard_acquire(&operator()(uttt::IBoard_const&)::rd), iVar6 != 0)) {
    std::random_device::random_device(&operator()::rd);
    __cxa_atexit(std::random_device::~random_device,&operator()::rd,&__dso_handle);
    __cxa_guard_release(&operator()(uttt::IBoard_const&)::rd);
  }
  if ((operator()(uttt::IBoard_const&)::gen == '\0') &&
     (iVar6 = __cxa_guard_acquire(&operator()(uttt::IBoard_const&)::gen), iVar6 != 0)) {
    uVar7 = std::random_device::_M_getval();
    uVar9 = (ulong)uVar7;
    lVar8 = 1;
    operator()::gen._M_x[0] = uVar9;
    do {
      uVar9 = (ulong)(((uint)(uVar9 >> 0x1e) ^ (uint)uVar9) * 0x6c078965 + (int)lVar8);
      operator()::gen._M_x[lVar8] = uVar9;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x270);
    operator()::gen._M_p = 0x270;
    __cxa_guard_release(&operator()(uttt::IBoard_const&)::gen);
  }
  local_48.macro = game->macro;
  local_48.micro._M_elems[0] = (game->micro)._M_elems[0];
  local_48.micro._M_elems[1] = (game->micro)._M_elems[1];
  local_48.micro._M_elems._4_8_ = *(undefined8 *)((game->micro)._M_elems + 2);
  local_48._16_8_ = *(undefined8 *)((game->micro)._M_elems + 6);
  cVar1 = g_macro_board_status[local_48.macro];
  if (cVar1 != '\0') {
    if (cVar1 == '\x03') {
      return 0;
    }
    if (cVar1 != -1) {
      return (int)cVar1;
    }
  }
  do {
    lVar8 = (long)local_48.next;
    if (lVar8 < 0) {
      local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (long *)0x0;
      local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (long *)0x0;
      paVar10 = &local_48.micro;
      lVar8 = 0;
      do {
        sVar2 = paVar10->_M_elems[0];
        pcVar3 = g_moves[sVar2].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar4 = g_moves[sVar2].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pcVar3 != pcVar4) {
          local_50._M_param._M_b = ~(uint)pcVar3 + (int)pcVar4;
          local_50._M_param._M_a = 0;
          rVar5 = std::uniform_int_distribution<int>::operator()
                            (&local_50,&operator()::gen,&local_50._M_param);
          local_80 = (param_type)
                     (long)((int)g_moves[sVar2].super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_start[rVar5] + (int)lVar8);
          if (local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (&local_78,
                       (iterator)
                       local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long *)&local_80);
          }
          else {
            *local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = (long)local_80;
            local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish = local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
        }
        lVar8 = lVar8 + 9;
        paVar10 = (array<short,_9UL> *)(paVar10->_M_elems + 1);
      } while (lVar8 != 0x51);
      local_80 = (param_type)
                 ((ulong)((int)((ulong)((long)local_78.
                                              super__Vector_base<long,_std::allocator<long>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_78.
                                             super__Vector_base<long,_std::allocator<long>_>._M_impl
                                             .super__Vector_impl_data._M_start) >> 3) - 1) << 0x20);
      rVar5 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&local_80,&operator()::gen,&local_80);
      local_58 = local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start[rVar5];
      operator_delete(local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    else {
      sVar2 = local_48.micro._M_elems[lVar8];
      local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((ulong)(~*(uint *)&g_moves[sVar2].
                                              super__Vector_base<char,_std::allocator<char>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                  *(int *)&g_moves[sVar2].
                                           super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                           super__Vector_impl_data._M_finish) << 0x20);
      rVar5 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&local_78,&operator()::gen,
                         (param_type *)&local_78);
      local_58 = (long)g_moves[sVar2].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start[rVar5] + lVar8 * 9;
    }
    IBoard::ApplyMove(&local_48,&local_58);
    cVar1 = g_macro_board_status[local_48.macro];
    iVar6 = -1;
    if (cVar1 != '\0') {
      if (cVar1 == '\x03') {
        return 0;
      }
      iVar6 = (int)cVar1;
    }
  } while (iVar6 == -1);
  return iVar6;
}

Assistant:

int
RandomPlayout::operator()(const uttt::IBoard &game) const
{
    static std::random_device rd;
    static std::mt19937 gen(rd());

    auto ngame(game);
    int status = ngame.GetStatus();
    while (status == game::Undecided)
    {
        game::IMove m = -1;
        if (ngame.next >= 0)
            m = ngame.next * 9 + g_moves[ngame.micro[ngame.next]][std::uniform_int_distribution<>(0, g_moves[ngame.micro[ngame.next]].size() - 1)(gen)];
        else
        {
            std::vector<game::IMove> moves;
            for (int i = 0; i < 9; i++)
                if (!g_moves[ngame.micro[i]].empty())
                    moves.push_back(i * 9 + g_moves[ngame.micro[i]][std::uniform_int_distribution<>(0, g_moves[ngame.micro[i]].size() - 1)(gen)]);
            m = moves[std::uniform_int_distribution<>(0, moves.size() - 1)(gen)];
        }
        ngame.ApplyMove(m);
        status = ngame.GetStatus();
    }
    return status;
}